

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger class_getfuncinfos(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr o;
  
  pSVar2 = stack_get(v,1);
  o.super_SQObject._type = (pSVar2->super_SQObject)._type;
  o.super_SQObject._flags = (pSVar2->super_SQObject)._flags;
  o.super_SQObject._5_3_ = *(undefined3 *)&(pSVar2->super_SQObject).field_0x5;
  o.super_SQObject._unVal = (SQObjectValue)(pSVar2->super_SQObject)._unVal.pClass;
  if ((o.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((o.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((o.super_SQObject._unVal.pClass)->_metamethods[0xb].super_SQObject._type == OT_NULL) {
    sq_pushnull(v);
  }
  else {
    closure_getfuncinfos_obj(v,(o.super_SQObject._unVal.pClass)->_metamethods + 0xb);
  }
  SQObjectPtr::~SQObjectPtr(&o);
  return 1;
}

Assistant:

static SQInteger class_getfuncinfos(HSQUIRRELVM v)
{
  SQObjectPtr o = stack_get(v, 1);

  if (!sq_isnull(_class(o)->_metamethods[MT_CALL]))
    closure_getfuncinfos_obj(v, _class(o)->_metamethods[MT_CALL]);
  else
    sq_pushnull(v);

  return 1;
}